

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void ImFontAtlasBuildFinish(ImFontAtlas *atlas)

{
  float fVar1;
  ushort uVar2;
  uint *puVar3;
  uint *puVar4;
  long lVar5;
  ImFont *this;
  int iVar6;
  ImFontAtlasCustomRect *pIVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  uchar *__s;
  long lVar15;
  uint uVar16;
  ulong __n;
  float fVar17;
  ImVec2 uv1;
  ImVec2 uv0;
  long local_48;
  
  if ((atlas->TexPixelsAlpha8 == (uchar *)0x0) && (atlas->TexPixelsRGBA32 == (uint *)0x0)) {
    __assert_fail("atlas->TexPixelsAlpha8 != __null || atlas->TexPixelsRGBA32 != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui_draw.cpp"
                  ,0xae0,"void ImFontAtlasBuildFinish(ImFontAtlas *)");
  }
  pIVar7 = ImFontAtlas::GetCustomRectByIndex(atlas,atlas->PackIdMouseCursors);
  uVar2 = pIVar7->X;
  if (uVar2 == 0xffff) {
    __assert_fail("r->IsPacked()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui_draw.cpp"
                  ,0xa6f,"void ImFontAtlasBuildRenderDefaultTexData(ImFontAtlas *)");
  }
  if ((atlas->Flags & 2) == 0) {
    if ((pIVar7->Width != 0xf5) || (pIVar7->Height != 0x1b)) {
      __assert_fail("r->Width == FONT_ATLAS_DEFAULT_TEX_DATA_W * 2 + 1 && r->Height == FONT_ATLAS_DEFAULT_TEX_DATA_H"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui_draw.cpp"
                    ,0xa75,"void ImFontAtlasBuildRenderDefaultTexData(ImFontAtlas *)");
    }
    if (atlas->TexPixelsAlpha8 == (uchar *)0x0) {
      ImFontAtlasBuildRender32bppRectFromString
                (atlas,(uint)uVar2,(uint)pIVar7->Y,0x7a,0x1b,
                 "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          - XX       XX ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         -X..X     X..X---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         -X...X   X...XX           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         - X...X X...X XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         -  X...X...X  X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       -   X.....X   X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    -    X...X    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  -     X.X     X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X -    X...X    X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..X-   X.....X   X......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..X-  X...X...X  X.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........X- X...X X...X X........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............X-X...X   X...XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............X-X..X     X..XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............X- XX       XX X......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............X--------------X...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...." /* TRUNCATED STRING LITERAL */
                 ,'.',0xffffffff);
      ImFontAtlasBuildRender32bppRectFromString
                (atlas,uVar2 + 0x7b,(uint)pIVar7->Y,0x7a,0x1b,
                 "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          - XX       XX ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         -X..X     X..X---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         -X...X   X...XX           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         - X...X X...X XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         -  X...X...X  X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       -   X.....X   X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    -    X...X    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  -     X.X     X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X -    X...X    X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..X-   X.....X   X......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..X-  X...X...X  X.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........X- X...X X...X X........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............X-X...X   X...XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............X-X..X     X..XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............X- XX       XX X......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............X--------------X...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...." /* TRUNCATED STRING LITERAL */
                 ,'X',0xffffffff);
    }
    else {
      ImFontAtlasBuildRender8bppRectFromString
                (atlas,(uint)uVar2,(uint)pIVar7->Y,0x7a,0x1b,
                 "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          - XX       XX ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         -X..X     X..X---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         -X...X   X...XX           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         - X...X X...X XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         -  X...X...X  X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       -   X.....X   X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    -    X...X    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  -     X.X     X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X -    X...X    X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..X-   X.....X   X......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..X-  X...X...X  X.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........X- X...X X...X X........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............X-X...X   X...XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............X-X..X     X..XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............X- XX       XX X......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............X--------------X...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...." /* TRUNCATED STRING LITERAL */
                 ,'.',0xff);
      ImFontAtlasBuildRender8bppRectFromString
                (atlas,uVar2 + 0x7b,(uint)pIVar7->Y,0x7a,0x1b,
                 "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          - XX       XX ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         -X..X     X..X---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         -X...X   X...XX           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         - X...X X...X XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         -  X...X...X  X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       -   X.....X   X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    -    X...X    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  -     X.X     X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X -    X...X    X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..X-   X.....X   X......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..X-  X...X...X  X.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........X- X...X X...X X........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............X-X...X   X...XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............X-X..X     X..XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............X- XX       XX X......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............X--------------X...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...." /* TRUNCATED STRING LITERAL */
                 ,'X',0xff);
    }
  }
  else {
    if ((pIVar7->Width != 2) || (pIVar7->Height != 2)) {
      __assert_fail("r->Width == 2 && r->Height == 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui_draw.cpp"
                    ,0xa86,"void ImFontAtlasBuildRenderDefaultTexData(ImFontAtlas *)");
    }
    iVar9 = atlas->TexWidth;
    iVar6 = (uint)pIVar7->Y * iVar9 + (uint)uVar2;
    if (atlas->TexPixelsAlpha8 == (uchar *)0x0) {
      puVar3 = atlas->TexPixelsRGBA32;
      puVar4 = puVar3 + (iVar9 + iVar6);
      puVar4[0] = 0xffffffff;
      puVar4[1] = 0xffffffff;
      puVar3 = puVar3 + iVar6;
      puVar3[0] = 0xffffffff;
      puVar3[1] = 0xffffffff;
    }
    else {
      atlas->TexPixelsAlpha8[(long)(iVar9 + iVar6) + 1] = 0xff;
      atlas->TexPixelsAlpha8[iVar9 + iVar6] = 0xff;
      atlas->TexPixelsAlpha8[(long)iVar6 + 1] = 0xff;
      atlas->TexPixelsAlpha8[iVar6] = 0xff;
    }
  }
  uVar2 = pIVar7->Y;
  fVar1 = (atlas->TexUvScale).y;
  (atlas->TexUvWhitePixel).x = ((float)pIVar7->X + 0.5) * (atlas->TexUvScale).x;
  (atlas->TexUvWhitePixel).y = ((float)uVar2 + 0.5) * fVar1;
  if ((atlas->Flags & 4) == 0) {
    pIVar7 = ImFontAtlas::GetCustomRectByIndex(atlas,atlas->PackIdLines);
    if (pIVar7->X == 0xffff) {
      __assert_fail("r->IsPacked()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui_draw.cpp"
                    ,0xa9b,"void ImFontAtlasBuildRenderLinesTexData(ImFontAtlas *)");
    }
    local_48 = 0;
    iVar9 = 0;
    __n = 0;
    do {
      if (pIVar7->Height <= __n) {
        __assert_fail("pad_left + line_width + pad_right == r->Width && y < r->Height",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui_draw.cpp"
                      ,0xaa5,"void ImFontAtlasBuildRenderLinesTexData(ImFontAtlas *)");
      }
      uVar2 = pIVar7->Width;
      iVar6 = (int)__n;
      uVar11 = (uint)uVar2 - iVar6;
      uVar16 = uVar11 >> 1;
      uVar12 = uVar16 + iVar6;
      uVar13 = (uint)uVar2;
      if (atlas->TexPixelsAlpha8 == (uchar *)0x0) {
        puVar4 = atlas->TexPixelsRGBA32;
        uVar10 = (ulong)(((uint)pIVar7->Y + iVar6) * atlas->TexWidth + (uint)pIVar7->X);
        if (1 < uVar11) {
          uVar8 = (ulong)(iVar9 + (uint)uVar2 >> 1);
          lVar14 = 0;
          do {
            puVar4[uVar10 + lVar14] = 0xffffff;
            lVar14 = lVar14 + 1;
          } while (uVar8 + (uVar8 == 0) != lVar14);
        }
        if (__n != 0) {
          memset(puVar4 + uVar10 + uVar16,0xff,__n * 4);
        }
        if (uVar2 != uVar12) {
          uVar11 = uVar13 + iVar9 >> 1;
          uVar8 = (ulong)((uVar13 + iVar9) - uVar11);
          lVar14 = 0;
          do {
            *(undefined4 *)((long)puVar4 + lVar14 + local_48 + (ulong)uVar11 * 4 + uVar10 * 4) =
                 0xffffff;
            lVar14 = lVar14 + 4;
          } while ((uVar8 + (uVar8 == 0)) * 4 != lVar14);
        }
      }
      else {
        __s = atlas->TexPixelsAlpha8 +
              (((uint)pIVar7->Y + iVar6) * atlas->TexWidth + (uint)pIVar7->X);
        if (1 < uVar11) {
          memset(__s,0,(ulong)(uVar16 + (uVar16 == 0)));
        }
        if (__n != 0) {
          memset(__s + uVar16,0xff,__n);
        }
        if (uVar13 != uVar12) {
          memset(__s + uVar16 + __n,0,(ulong)((uVar13 - uVar12) + (uint)(uVar13 - uVar12 == 0)));
        }
      }
      uVar2 = pIVar7->X;
      fVar1 = (atlas->TexUvScale).x;
      fVar17 = (atlas->TexUvScale).y;
      uVar10 = __n + 1;
      fVar17 = ((float)(int)(pIVar7->Y + 1 + iVar6) * fVar17 +
               (float)(int)((uint)pIVar7->Y + iVar6) * fVar17) * 0.5;
      atlas->TexUvLines[__n].x = (float)((uVar16 + uVar2) - 1) * fVar1;
      atlas->TexUvLines[__n].y = fVar17;
      atlas->TexUvLines[__n].z = (float)((int)uVar10 + uVar16 + uVar2) * fVar1;
      atlas->TexUvLines[__n].w = fVar17;
      iVar9 = iVar9 + -1;
      local_48 = local_48 + 4;
      __n = uVar10;
    } while (uVar10 != 0x40);
  }
  if (0 < (atlas->CustomRects).Size) {
    lVar14 = 0;
    lVar15 = 0;
    do {
      pIVar7 = (atlas->CustomRects).Data;
      lVar5 = *(long *)((long)&pIVar7->Font + lVar14);
      if ((lVar5 != 0) && (*(int *)((long)&pIVar7->GlyphID + lVar14) != 0)) {
        if (*(ImFontAtlas **)(lVar5 + 0x40) != atlas) {
          __assert_fail("r->Font->ContainerAtlas == atlas",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui_draw.cpp"
                        ,0xaec,"void ImFontAtlasBuildFinish(ImFontAtlas *)");
        }
        uv0.x = 0.0;
        uv0.y = 0.0;
        uv1.x = 0.0;
        uv1.y = 0.0;
        ImFontAtlas::CalcCustomRectUV
                  (atlas,(ImFontAtlasCustomRect *)((long)&pIVar7->Width + lVar14),&uv0,&uv1);
        fVar1 = *(float *)((long)&(pIVar7->GlyphOffset).x + lVar14);
        fVar17 = *(float *)((long)&(pIVar7->GlyphOffset).y + lVar14);
        ImFont::AddGlyph(*(ImFont **)((long)&pIVar7->Font + lVar14),(ImFontConfig *)0x0,
                         *(ImWchar *)((long)&pIVar7->GlyphID + lVar14),fVar1,fVar17,
                         (float)*(ushort *)((long)&pIVar7->Width + lVar14) + fVar1,
                         (float)*(ushort *)((long)&pIVar7->Height + lVar14) + fVar17,uv0.x,uv0.y,
                         uv1.x,uv1.y,*(float *)((long)&pIVar7->GlyphAdvanceX + lVar14));
      }
      lVar15 = lVar15 + 1;
      lVar14 = lVar14 + 0x20;
    } while (lVar15 < (atlas->CustomRects).Size);
  }
  if (0 < (atlas->Fonts).Size) {
    lVar14 = 0;
    do {
      this = (atlas->Fonts).Data[lVar14];
      if (this->DirtyLookupTables == true) {
        ImFont::BuildLookupTable(this);
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < (atlas->Fonts).Size);
  }
  atlas->TexReady = true;
  return;
}

Assistant:

void ImFontAtlasBuildFinish(ImFontAtlas* atlas)
{
    // Render into our custom data blocks
    IM_ASSERT(atlas->TexPixelsAlpha8 != NULL || atlas->TexPixelsRGBA32 != NULL);
    ImFontAtlasBuildRenderDefaultTexData(atlas);
    ImFontAtlasBuildRenderLinesTexData(atlas);

    // Register custom rectangle glyphs
    for (int i = 0; i < atlas->CustomRects.Size; i++)
    {
        const ImFontAtlasCustomRect* r = &atlas->CustomRects[i];
        if (r->Font == NULL || r->GlyphID == 0)
            continue;

        // Will ignore ImFontConfig settings: GlyphMinAdvanceX, GlyphMinAdvanceY, GlyphExtraSpacing, PixelSnapH
        IM_ASSERT(r->Font->ContainerAtlas == atlas);
        ImVec2 uv0, uv1;
        atlas->CalcCustomRectUV(r, &uv0, &uv1);
        r->Font->AddGlyph(NULL, (ImWchar)r->GlyphID, r->GlyphOffset.x, r->GlyphOffset.y, r->GlyphOffset.x + r->Width, r->GlyphOffset.y + r->Height, uv0.x, uv0.y, uv1.x, uv1.y, r->GlyphAdvanceX);
    }

    // Build all fonts lookup tables
    for (int i = 0; i < atlas->Fonts.Size; i++)
        if (atlas->Fonts[i]->DirtyLookupTables)
            atlas->Fonts[i]->BuildLookupTable();

    atlas->TexReady = true;
}